

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::BreakStmt::set_parent(BreakStmt *this,IRNode *parent)

{
  IRNodeKind IVar1;
  StatementType SVar2;
  int iVar3;
  undefined4 extraout_var;
  UserException *this_00;
  allocator<char> local_51;
  string local_50;
  Stmt *local_30;
  Stmt *s;
  IRNode *p;
  Stmt *for_;
  IRNode *parent_local;
  BreakStmt *this_local;
  
  p = (IRNode *)0x0;
  s = (Stmt *)parent;
  for_ = (Stmt *)parent;
  parent_local = (IRNode *)this;
  do {
    if (s == (Stmt *)0x0) {
LAB_00289e02:
      if (p != (IRNode *)0x0) {
        Stmt::set_parent(&this->super_Stmt,&for_->super_IRNode);
        return;
      }
      this_00 = (UserException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Break statement not allowed outside loop",&local_51);
      UserException::UserException(this_00,&local_50);
      __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
    }
    IVar1 = IRNode::ir_node_kind(&s->super_IRNode);
    if (IVar1 == StmtKind) {
      local_30 = s;
      SVar2 = Stmt::type(s);
      if (SVar2 == For) {
        p = &local_30->super_IRNode;
        goto LAB_00289e02;
      }
    }
    iVar3 = (*(s->super_IRNode)._vptr_IRNode[4])();
    s = (Stmt *)CONCAT44(extraout_var,iVar3);
  } while( true );
}

Assistant:

void BreakStmt::set_parent(IRNode *parent) {
    // making sure we are inside a for loop
    Stmt *for_ = nullptr;
    auto *p = parent;
    while (p) {
        if (p->ir_node_kind() == IRNodeKind::StmtKind) {
            auto *s = reinterpret_cast<Stmt *>(p);
            if (s->type() == StatementType::For) {
                for_ = s;
                break;
            }
        }
        p = p->parent();
    }
    if (for_ == nullptr) {
        throw UserException("Break statement not allowed outside loop");
    }
    Stmt::set_parent(parent);
}